

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChContactSurfaceMesh::SurfaceAddCollisionModelsToSystem
          (ChContactSurfaceMesh *this,ChSystem *msys)

{
  uint uVar1;
  __shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  if (msys != (ChSystem *)0x0) {
    (*(this->super_ChContactSurface)._vptr_ChContactSurface[2])();
    for (uVar1 = 0;
        (ulong)uVar1 <
        (ulong)((long)(this->vfaces).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->vfaces).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4); uVar1 = uVar1 + 1) {
      std::__shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_38,
                   &(msys->collision_system).
                    super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                  );
      (*(local_38._M_ptr)->_vptr_ChCollisionSystem[4])
                (local_38._M_ptr,
                 ((this->vfaces).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar1].
                  super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->collision_model);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    }
    for (uVar1 = 0;
        (ulong)uVar1 <
        (ulong)((long)(this->vfaces_rot).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->vfaces_rot).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4); uVar1 = uVar1 + 1) {
      std::__shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_38,
                   &(msys->collision_system).
                    super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                  );
      (*(local_38._M_ptr)->_vptr_ChCollisionSystem[4])
                (local_38._M_ptr,
                 ((this->vfaces_rot).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar1].
                  super___shared_ptr<chrono::fea::ChContactTriangleXYZROT,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->collision_model);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    }
    return;
  }
  __assert_fail("msys",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChContactSurfaceMesh.cpp"
                ,0x4f4,
                "virtual void chrono::fea::ChContactSurfaceMesh::SurfaceAddCollisionModelsToSystem(ChSystem *)"
               );
}

Assistant:

void ChContactSurfaceMesh::SurfaceAddCollisionModelsToSystem(ChSystem* msys) {
    assert(msys);
    SurfaceSyncCollisionModels();
    for (unsigned int j = 0; j < vfaces.size(); j++) {
        msys->GetCollisionSystem()->Add(vfaces[j]->GetCollisionModel());
    }
    for (unsigned int j = 0; j < vfaces_rot.size(); j++) {
        msys->GetCollisionSystem()->Add(vfaces_rot[j]->GetCollisionModel());
    }
}